

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O3

bool __thiscall duckdb::PhysicalOperator::AllSourcesSupportBatchIndex(PhysicalOperator *this)

{
  undefined8 *puVar1;
  byte bVar2;
  undefined8 *puVar3;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> sources;
  undefined1 local_60 [8];
  void *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  (*this->_vptr_PhysicalOperator[0x25])(&local_40,this);
  if (local_40 == local_38) {
    bVar2 = 1;
  }
  else {
    puVar1 = local_40;
    do {
      puVar3 = puVar1 + 1;
      local_60[0] = 1;
      local_58 = (void *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      bVar2 = (**(code **)(*(long *)*puVar1 + 0xa8))((long *)*puVar1,local_60);
      if (local_58 != (void *)0x0) {
        operator_delete(local_58);
      }
      puVar1 = puVar3;
    } while ((bVar2 & puVar3 != local_38) != 0);
  }
  if (local_40 != (undefined8 *)0x0) {
    operator_delete(local_40);
  }
  return (bool)bVar2;
}

Assistant:

bool PhysicalOperator::AllSourcesSupportBatchIndex() const {
	auto sources = GetSources();
	for (auto &source : sources) {
		if (!source.get().SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			return false;
		}
	}
	return true;
}